

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

ASYNC_OPERATION_HANDLE
link_transfer_async(LINK_HANDLE link,message_format message_format,PAYLOAD *payloads,
                   size_t payload_count,ON_DELIVERY_SETTLED on_delivery_settled,
                   void *callback_context,LINK_TRANSFER_RESULT *link_transfer_error,
                   tickcounter_ms_t timeout)

{
  int iVar1;
  SESSION_SEND_TRANSFER_RESULT SVar2;
  LOGGER_LOG p_Var3;
  TRANSFER_HANDLE transfer_00;
  AMQP_VALUE value;
  LIST_ITEM_HANDLE item;
  code *on_send_complete;
  bool settled_value;
  delivery_tag delivery_tag_value;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LIST_ITEM_HANDLE delivery_instance_list_item;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  DELIVERY_INSTANCE *pending_delivery;
  LOGGER_LOG l_8;
  AMQP_VALUE transfer_value;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  _Bool settled;
  delivery_tag delivery_tag;
  uchar delivery_tag_bytes [4];
  sequence_no delivery_count;
  LOGGER_LOG l_4;
  TRANSFER_HANDLE transfer;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  ASYNC_OPERATION_HANDLE result;
  void *callback_context_local;
  ON_DELIVERY_SETTLED on_delivery_settled_local;
  size_t payload_count_local;
  PAYLOAD *payloads_local;
  message_format message_format_local;
  LINK_HANDLE link_local;
  
  if ((link == (LINK_HANDLE)0x0) || (link_transfer_error == (LINK_TRANSFER_RESULT *)0x0)) {
    if (link_transfer_error != (LINK_TRANSFER_RESULT *)0x0) {
      *link_transfer_error = LINK_TRANSFER_ERROR;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_transfer_async",0x558,1,
                "Invalid arguments: link = %p, link_transfer_error = %p",link,link_transfer_error);
    }
    l = (LOGGER_LOG)0x0;
  }
  else if ((link->role & 1U) == 0) {
    if (link->link_state == LINK_STATE_ATTACHED) {
      if (link->current_link_credit == 0) {
        *link_transfer_error = LINK_TRANSFER_BUSY;
        l = (LOGGER_LOG)0x0;
      }
      else {
        l = (LOGGER_LOG)async_operation_create(link_transfer_cancel_handler,0x38);
        if ((ASYNC_OPERATION_HANDLE)l == (ASYNC_OPERATION_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                      ,"link_transfer_async",0x573,1,"Error creating async operation");
          }
          *link_transfer_error = LINK_TRANSFER_ERROR;
        }
        else {
          transfer_00 = transfer_create(0);
          if (transfer_00 == (TRANSFER_HANDLE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                        ,"link_transfer_async",0x57b,1,"Error creating transfer");
            }
            *link_transfer_error = LINK_TRANSFER_ERROR;
            async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
            l = (LOGGER_LOG)0x0;
          }
          else {
            delivery_tag.length = link->delivery_count + 1;
            delivery_tag.bytes._0_4_ = 4;
            settled_value = link->snd_settle_mode != '\0';
            delivery_tag_value.length = 4;
            delivery_tag_value.bytes = &delivery_tag.length;
            delivery_tag_value._12_4_ = 0;
            delivery_tag._12_4_ = delivery_tag.length;
            iVar1 = transfer_set_delivery_tag(transfer_00,delivery_tag_value);
            if (iVar1 == 0) {
              iVar1 = transfer_set_message_format(transfer_00,message_format);
              if (iVar1 == 0) {
                iVar1 = transfer_set_settled(transfer_00,settled_value);
                if (iVar1 == 0) {
                  value = amqpvalue_create_transfer(transfer_00);
                  if (value == (AMQP_VALUE)0x0) {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                                ,"link_transfer_async",0x5af,1,
                                "Failed creating transfer performative AMQP value");
                    }
                    *link_transfer_error = LINK_TRANSFER_ERROR;
                    async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                    l = (LOGGER_LOG)0x0;
                  }
                  else {
                    if ((ASYNC_OPERATION_HANDLE)((long)l + 8) == (ASYNC_OPERATION_HANDLE)0x0) {
                      p_Var3 = xlogging_get_log_function();
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        (*p_Var3)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                                  ,"link_transfer_async",0x5b9,1,"Failed getting pending delivery");
                      }
                      *link_transfer_error = LINK_TRANSFER_ERROR;
                      async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                      l = (LOGGER_LOG)0x0;
                    }
                    else {
                      iVar1 = tickcounter_get_current_ms
                                        (link->tick_counter,(tickcounter_ms_t *)((long)l + 0x28));
                      if (iVar1 == 0) {
                        ((ASYNC_OPERATION_HANDLE)((long)l + 0x30))->async_operation_cancel_handler =
                             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)timeout;
                        ((ASYNC_OPERATION_HANDLE)((long)l + 0x10))->async_operation_cancel_handler =
                             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)on_delivery_settled;
                        ((ASYNC_OPERATION_HANDLE)((long)l + 0x18))->async_operation_cancel_handler =
                             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)callback_context;
                        ((ASYNC_OPERATION_HANDLE)((long)l + 0x20))->async_operation_cancel_handler =
                             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)link;
                        item = singlylinkedlist_add(link->pending_deliveries,l);
                        if (item == (LIST_ITEM_HANDLE)0x0) {
                          p_Var3 = xlogging_get_log_function();
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                                      ,"link_transfer_async",0x5d2,1,
                                      "Failed adding delivery to list");
                          }
                          *link_transfer_error = LINK_TRANSFER_ERROR;
                          async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                          l = (LOGGER_LOG)0x0;
                        }
                        else {
                          on_send_complete = (ON_SEND_COMPLETE)0x0;
                          if (settled_value) {
                            on_send_complete = ::on_send_complete;
                          }
                          SVar2 = session_send_transfer
                                            (link->link_endpoint,transfer_00,payloads,payload_count,
                                             (delivery_number *)((long)l + 8),on_send_complete,item)
                          ;
                          if (SVar2 == SESSION_SEND_TRANSFER_OK) {
                            link->delivery_count = delivery_tag._12_4_;
                            link->current_link_credit = link->current_link_credit - 1;
                          }
                          else if ((SVar2 == SESSION_SEND_TRANSFER_ERROR) ||
                                  (SVar2 != SESSION_SEND_TRANSFER_BUSY)) {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                                        ,"link_transfer_async",0x5de,1,
                                        "Failed session send transfer");
                            }
                            iVar1 = singlylinkedlist_remove(link->pending_deliveries,item);
                            if (iVar1 == 0) {
                              async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                            }
                            *link_transfer_error = LINK_TRANSFER_ERROR;
                            l = (LOGGER_LOG)0x0;
                          }
                          else {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                                        ,"link_transfer_async",0x5ea,1,
                                        "Failed session send transfer");
                            }
                            iVar1 = singlylinkedlist_remove(link->pending_deliveries,item);
                            if (iVar1 == 0) {
                              async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                            }
                            *link_transfer_error = LINK_TRANSFER_BUSY;
                            l = (LOGGER_LOG)0x0;
                          }
                        }
                      }
                      else {
                        p_Var3 = xlogging_get_log_function();
                        if (p_Var3 != (LOGGER_LOG)0x0) {
                          (*p_Var3)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                                    ,"link_transfer_async",0x5c2,1,"Failed getting current tick");
                        }
                        *link_transfer_error = LINK_TRANSFER_ERROR;
                        async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                        l = (LOGGER_LOG)0x0;
                      }
                    }
                    amqpvalue_destroy(value);
                  }
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                              ,"link_transfer_async",0x5a5,1,"Failed setting settled flag");
                  }
                  *link_transfer_error = LINK_TRANSFER_ERROR;
                  async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                  l = (LOGGER_LOG)0x0;
                }
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                            ,"link_transfer_async",0x59e,1,"Failed setting message format");
                }
                *link_transfer_error = LINK_TRANSFER_ERROR;
                async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                l = (LOGGER_LOG)0x0;
              }
            }
            else {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                          ,"link_transfer_async",0x597,1,"Failed setting delivery tag");
              }
              *link_transfer_error = LINK_TRANSFER_ERROR;
              async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
              l = (LOGGER_LOG)0x0;
            }
            transfer_destroy(transfer_00);
          }
        }
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                  ,"link_transfer_async",0x565,1,"Link is not attached");
      }
      *link_transfer_error = LINK_TRANSFER_ERROR;
      l = (LOGGER_LOG)0x0;
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_transfer_async",0x55f,1,"Link is not a sender link");
    }
    *link_transfer_error = LINK_TRANSFER_ERROR;
    l = (LOGGER_LOG)0x0;
  }
  return (ASYNC_OPERATION_HANDLE)l;
}

Assistant:

ASYNC_OPERATION_HANDLE link_transfer_async(LINK_HANDLE link, message_format message_format, PAYLOAD* payloads, size_t payload_count, ON_DELIVERY_SETTLED on_delivery_settled, void* callback_context, LINK_TRANSFER_RESULT* link_transfer_error, tickcounter_ms_t timeout)
{
    ASYNC_OPERATION_HANDLE result;

    if ((link == NULL) ||
        (link_transfer_error == NULL))
    {
        if (link_transfer_error != NULL)
        {
            *link_transfer_error = LINK_TRANSFER_ERROR;
        }

        LogError("Invalid arguments: link = %p, link_transfer_error = %p",
            link, link_transfer_error);
        result = NULL;
    }
    else
    {
        if (link->role != role_sender)
        {
            LogError("Link is not a sender link");
            *link_transfer_error = LINK_TRANSFER_ERROR;
            result = NULL;
        }
        else if (link->link_state != LINK_STATE_ATTACHED)
        {
            LogError("Link is not attached");
            *link_transfer_error = LINK_TRANSFER_ERROR;
            result = NULL;
        }
        else if (link->current_link_credit == 0)
        {
            *link_transfer_error = LINK_TRANSFER_BUSY;
            result = NULL;
        }
        else
        {
            result = CREATE_ASYNC_OPERATION(DELIVERY_INSTANCE, link_transfer_cancel_handler);
            if (result == NULL)
            {
                LogError("Error creating async operation");
                *link_transfer_error = LINK_TRANSFER_ERROR;
            }
            else
            {
                TRANSFER_HANDLE transfer = transfer_create(0);
                if (transfer == NULL)
                {
                    LogError("Error creating transfer");
                    *link_transfer_error = LINK_TRANSFER_ERROR;
                    async_operation_destroy(result);
                    result = NULL;
                }
                else
                {
                    sequence_no delivery_count = link->delivery_count + 1;
                    unsigned char delivery_tag_bytes[sizeof(delivery_count)];
                    delivery_tag delivery_tag;
                    bool settled;

                    (void)memcpy(delivery_tag_bytes, &delivery_count, sizeof(delivery_count));

                    delivery_tag.bytes = &delivery_tag_bytes;
                    delivery_tag.length = sizeof(delivery_tag_bytes);

                    if (link->snd_settle_mode == sender_settle_mode_unsettled)
                    {
                        settled = false;
                    }
                    else
                    {
                        settled = true;
                    }

                    if (transfer_set_delivery_tag(transfer, delivery_tag) != 0)
                    {
                        LogError("Failed setting delivery tag");
                        *link_transfer_error = LINK_TRANSFER_ERROR;
                        async_operation_destroy(result);
                        result = NULL;
                    }
                    else if (transfer_set_message_format(transfer, message_format) != 0)
                    {
                        LogError("Failed setting message format");
                        *link_transfer_error = LINK_TRANSFER_ERROR;
                        async_operation_destroy(result);
                        result = NULL;
                    }
                    else if (transfer_set_settled(transfer, settled) != 0)
                    {
                        LogError("Failed setting settled flag");
                        *link_transfer_error = LINK_TRANSFER_ERROR;
                        async_operation_destroy(result);
                        result = NULL;
                    }
                    else
                    {
                        AMQP_VALUE transfer_value = amqpvalue_create_transfer(transfer);
                        if (transfer_value == NULL)
                        {
                            LogError("Failed creating transfer performative AMQP value");
                            *link_transfer_error = LINK_TRANSFER_ERROR;
                            async_operation_destroy(result);
                            result = NULL;
                        }
                        else
                        {
                            DELIVERY_INSTANCE* pending_delivery = GET_ASYNC_OPERATION_CONTEXT(DELIVERY_INSTANCE, result);
                            if (pending_delivery == NULL)
                            {
                                LogError("Failed getting pending delivery");
                                *link_transfer_error = LINK_TRANSFER_ERROR;
                                async_operation_destroy(result);
                                result = NULL;
                            }
                            else
                            {
                                if (tickcounter_get_current_ms(link->tick_counter, &pending_delivery->start_tick) != 0)
                                {
                                    LogError("Failed getting current tick");
                                    *link_transfer_error = LINK_TRANSFER_ERROR;
                                    async_operation_destroy(result);
                                    result = NULL;
                                }
                                else
                                {
                                    LIST_ITEM_HANDLE delivery_instance_list_item;
                                    pending_delivery->timeout = timeout;
                                    pending_delivery->on_delivery_settled = on_delivery_settled;
                                    pending_delivery->callback_context = callback_context;
                                    pending_delivery->link = link;
                                    delivery_instance_list_item = singlylinkedlist_add(link->pending_deliveries, result);

                                    if (delivery_instance_list_item == NULL)
                                    {
                                        LogError("Failed adding delivery to list");
                                        *link_transfer_error = LINK_TRANSFER_ERROR;
                                        async_operation_destroy(result);
                                        result = NULL;
                                    }
                                    else
                                    {
                                        /* here we should feed data to the transfer frame */
                                        switch (session_send_transfer(link->link_endpoint, transfer, payloads, payload_count, &pending_delivery->delivery_id, (settled) ? on_send_complete : NULL, delivery_instance_list_item))
                                        {
                                        default:
                                        case SESSION_SEND_TRANSFER_ERROR:
                                            LogError("Failed session send transfer");
                                            if (singlylinkedlist_remove(link->pending_deliveries, delivery_instance_list_item) == 0)
                                            {
                                                async_operation_destroy(result);
                                            }

                                            *link_transfer_error = LINK_TRANSFER_ERROR;
                                            result = NULL;
                                            break;

                                        case SESSION_SEND_TRANSFER_BUSY:
                                            /* Ensure we remove from list again since sender will attempt to transfer again on flow on */
                                            LogError("Failed session send transfer");
                                            if (singlylinkedlist_remove(link->pending_deliveries, delivery_instance_list_item) == 0)
                                            {
                                                async_operation_destroy(result);
                                            }

                                            *link_transfer_error = LINK_TRANSFER_BUSY;
                                            result = NULL;
                                            break;

                                        case SESSION_SEND_TRANSFER_OK:
                                            link->delivery_count = delivery_count;
                                            link->current_link_credit--;
                                            break;
                                        }
                                    }
                                }
                            }

                            amqpvalue_destroy(transfer_value);
                        }
                    }

                    transfer_destroy(transfer);
                }
            }
        }
    }

    return result;
}